

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O3

string * __thiscall
deqp::gles3::Performance::textureLookupFragmentTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,int numLookups,
          ConditionalUsage conditionalUsage,ConditionalType conditionalType)

{
  ostringstream *poVar1;
  long *plVar2;
  char *pcVar3;
  string *extraout_RAX;
  string *psVar4;
  long *plVar5;
  char *pcVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ostringstream s;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  ConditionalUsage local_228;
  int local_224;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  Performance *local_1d8;
  char *local_1d0;
  string *local_1c8 [2];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_1e0 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1e0;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_228 = conditionalUsage;
  local_224 = numLookups;
  local_1d8 = this;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_228 == CONDITIONAL_USAGE_EVERY_OTHER && local_224 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (0 < (int)(uint)local_1d8) {
    iVar8 = 0;
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    do {
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::operator<<(poVar1,iVar8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1beae70);
      local_248 = &local_238;
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_238 = *plVar5;
        lStack_230 = plVar2[3];
      }
      else {
        local_238 = *plVar5;
        local_248 = (long *)*plVar2;
      }
      local_240 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_210 = *plVar5;
        lStack_208 = plVar2[3];
        local_220 = &local_210;
      }
      else {
        local_210 = *plVar5;
        local_220 = (long *)*plVar2;
      }
      local_218 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_220);
      if (local_220 != &local_210) {
        operator_delete(local_220,local_210 + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      iVar8 = iVar8 + 1;
    } while ((uint)local_1d8 != iVar8);
  }
  if (local_224 != 0 && local_228 == CONDITIONAL_USAGE_FIRST_HALF) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pcVar3 = (char *)0x0;
  if (local_228 == CONDITIONAL_USAGE_EVERY_OTHER) {
    pcVar3 = "v_condition${NAME_SPEC} > 0.0";
  }
  pcVar6 = "u_condition${NAME_SPEC} > 0.0";
  if (local_228 != CONDITIONAL_USAGE_FIRST_HALF) {
    pcVar6 = pcVar3;
  }
  local_1d0 = "1.0 > 0.0";
  if (local_228 != CONDITIONAL_USAGE_NONE) {
    local_1d0 = pcVar6;
  }
  if (local_224 == 1) {
    local_200 = &local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,0x1af8059);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_248 = &local_238;
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_238 = *plVar5;
      lStack_230 = plVar2[3];
    }
    else {
      local_238 = *plVar5;
      local_248 = (long *)*plVar2;
    }
    local_240 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_210 = *plVar5;
      lStack_208 = plVar2[3];
      local_220 = &local_210;
    }
    else {
      local_210 = *plVar5;
      local_220 = (long *)*plVar2;
    }
    local_218 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_220);
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_198 = *plVar5;
      lStack_190 = plVar2[3];
      local_1a8._M_allocated_capacity = (size_type)&local_198;
    }
    else {
      local_198 = *plVar5;
      local_1a8._M_allocated_capacity = (size_type)(long *)*plVar2;
    }
    local_1a8._8_8_ = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_1a8._M_allocated_capacity);
    if ((long *)local_1a8._M_allocated_capacity != &local_198) {
      operator_delete((void *)local_1a8._M_allocated_capacity,local_198 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
  }
  iVar8 = local_224;
  if (0 < (int)(uint)local_1d8) {
    local_228 = (int)(((uint)local_1d8 - ((int)((uint)local_1d8 + 1) >> 0x1f)) + 1) >> 1;
    uVar7 = (uint)local_1d8 - 1;
    uVar9 = 0;
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    do {
      if (local_224 == 1) {
        if ((int)uVar9 < (int)local_228) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      else if ((uVar9 & 1) == 0 && local_224 == 2) {
        local_200 = &local_1f0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,0x1af8059);
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_200);
        local_248 = &local_238;
        plVar5 = plVar2 + 2;
        if ((long *)*plVar2 == plVar5) {
          local_238 = *plVar5;
          lStack_230 = plVar2[3];
        }
        else {
          local_238 = *plVar5;
          local_248 = (long *)*plVar2;
        }
        local_240 = plVar2[1];
        *plVar2 = (long)plVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
        plVar5 = plVar2 + 2;
        if ((long *)*plVar2 == plVar5) {
          local_210 = *plVar5;
          lStack_208 = plVar2[3];
          local_220 = &local_210;
        }
        else {
          local_210 = *plVar5;
          local_220 = (long *)*plVar2;
        }
        local_218 = plVar2[1];
        *plVar2 = (long)plVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_220);
        local_1a8._M_allocated_capacity = (size_type)&local_198;
        plVar5 = plVar2 + 2;
        if ((long *)*plVar2 == plVar5) {
          local_198 = *plVar5;
          lStack_190 = plVar2[3];
        }
        else {
          local_198 = *plVar5;
          local_1a8._M_allocated_capacity = (size_type)(long *)*plVar2;
        }
        local_1a8._8_8_ = plVar2[1];
        *plVar2 = (long)plVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,local_1a8._M_allocated_capacity);
        if ((long *)local_1a8._M_allocated_capacity != &local_198) {
          operator_delete((void *)local_1a8._M_allocated_capacity,local_198 + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,local_238 + 1);
        }
        if (local_200 != &local_1f0) {
          operator_delete(local_200,local_1f0 + 1);
        }
      }
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::ostream::operator<<(poVar1,uVar9);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,0x1c25b24);
      local_248 = &local_238;
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_238 = *plVar5;
        lStack_230 = plVar2[3];
      }
      else {
        local_238 = *plVar5;
        local_248 = (long *)*plVar2;
      }
      local_240 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
      plVar5 = plVar2 + 2;
      if ((long *)*plVar2 == plVar5) {
        local_210 = *plVar5;
        lStack_208 = plVar2[3];
        local_220 = &local_210;
      }
      else {
        local_210 = *plVar5;
        local_220 = (long *)*plVar2;
      }
      local_218 = plVar2[1];
      *plVar2 = (long)plVar5;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_220);
      if (local_220 != &local_210) {
        operator_delete(local_220,local_210 + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,local_238 + 1);
      }
      if (local_200 != &local_1f0) {
        operator_delete(local_200,local_1f0 + 1);
      }
      if (uVar7 >> 1 == uVar9 && iVar8 == 1) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      uVar9 = uVar9 + 1;
    } while ((uint)local_1d8 != uVar9);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
  std::ostream::operator<<(local_1b8 + 0x10,(int)local_1d8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 0x10));
  std::ios_base::~ios_base(local_138);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x1c25b40);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_1f0 = *plVar5;
    lStack_1e8 = plVar2[3];
    local_200 = &local_1f0;
  }
  else {
    local_1f0 = *plVar5;
    local_200 = (long *)*plVar2;
  }
  local_1f8 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_248 = &local_238;
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_238 = *plVar5;
    lStack_230 = plVar2[3];
  }
  else {
    local_238 = *plVar5;
    local_248 = (long *)*plVar2;
  }
  local_240 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_248);
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_210 = *plVar5;
    lStack_208 = plVar2[3];
    local_220 = &local_210;
  }
  else {
    local_210 = *plVar5;
    local_220 = (long *)*plVar2;
  }
  local_218 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_220);
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210 + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,local_238 + 1);
  }
  if (local_200 != &local_1f0) {
    operator_delete(local_200,local_1f0 + 1);
  }
  psVar4 = (string *)local_1b8;
  if (local_1c8[0] != psVar4) {
    operator_delete(local_1c8[0],(ulong)(local_1b8._0_8_ + 1));
    psVar4 = extraout_RAX;
  }
  return psVar4;
}

Assistant:

static string textureLookupFragmentTemplate (int numLookups, ConditionalUsage conditionalUsage, ConditionalType conditionalType)
{
	string resultTemplate;

	resultTemplate +=
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"in mediump vec2 v_coords${NAME_SPEC};\n";

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_DYNAMIC)
		resultTemplate +=
			"in mediump float v_condition${NAME_SPEC};\n";

	for (int i = 0; i < numLookups; i++)
		resultTemplate +=
			"uniform sampler2D u_sampler" + de::toString(i) + "${NAME_SPEC};\n";

	if (conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_UNIFORM)
		resultTemplate +=
			"uniform mediump float u_condition${NAME_SPEC};\n";

	resultTemplate +=
		"\n"
		"void main()\n"
		"{\n"
		"	mediump vec4 color = vec4(0.0);\n";

	const char* conditionalTerm = conditionalType == CONDITIONAL_TYPE_STATIC	? "1.0 > 0.0"
								: conditionalType == CONDITIONAL_TYPE_UNIFORM	? "u_condition${NAME_SPEC} > 0.0"
								: conditionalType == CONDITIONAL_TYPE_DYNAMIC	? "v_condition${NAME_SPEC} > 0.0"
								: DE_NULL;

	DE_ASSERT(conditionalTerm != DE_NULL);

	if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF)
		resultTemplate += string("") +
			"	if (" + conditionalTerm + ")\n"
			"	{\n";

	for (int i = 0; i < numLookups; i++)
	{
		if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF)
		{
			if (i < (numLookups + 1) / 2)
				resultTemplate += "\t";
		}
		else if (conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER)
		{
			if (i % 2 == 0)
				resultTemplate += string("") +
					"	if (" + conditionalTerm + ")\n"
					"\t";
		}

		resultTemplate +=
			"	color += texture(u_sampler" + de::toString(i) + "${NAME_SPEC}, v_coords${NAME_SPEC});\n";

		if (conditionalUsage == CONDITIONAL_USAGE_FIRST_HALF && i == (numLookups - 1) / 2)
			resultTemplate += "\t}\n";
	}

	resultTemplate +=
		"	o_color = color/" + de::toString(numLookups) + ".0 + ${FLOAT01};\n" +
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}